

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckASCII(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  bool bVar2;
  Bool BVar3;
  char *pcVar4;
  AttVal *local_58;
  AttVal *av;
  int matchingCount;
  uint uStack_40;
  tmbchar compareLetter;
  int newLines;
  uint x;
  uint i;
  int HasSkipOverLink;
  Bool IsAscii;
  tmbstr skipOver;
  Node *temp2;
  Node *temp1;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  _HasSkipOverLink = (tmbstr)0x0;
  bVar2 = false;
  x = 0;
  matchingCount = -1;
  av._4_4_ = 0;
  BVar3 = Level1_Enabled(doc);
  if ((BVar3 != no) && (node->content != (Node *)0x0)) {
    uVar1 = node->content->start;
    do {
      newLines = uVar1 + 1;
      if (node->content->end <= (uint)newLines) break;
      av._4_4_ = 0;
      if (doc->lexer->lexbuf[(uint)newLines] == '\n') {
        matchingCount = matchingCount + 1;
      }
      for (uStack_40 = newLines;
          (uStack_40 < uVar1 + 6 &&
          (doc->lexer->lexbuf[uStack_40] == doc->lexer->lexbuf[(uint)newLines]));
          uStack_40 = uStack_40 + 1) {
        av._4_4_ = av._4_4_ + 1;
      }
      uVar1 = newLines;
    } while (av._4_4_ < 5);
    if ((5 < matchingCount) || (4 < av._4_4_)) {
      bVar2 = true;
    }
    if (((bVar2) && (node->prev != (Node *)0x0)) && (node->prev->prev != (Node *)0x0)) {
      for (local_58 = node->prev->prev->attributes; local_58 != (AttVal *)0x0;
          local_58 = local_58->next) {
        if (((local_58 != (AttVal *)0x0) && (local_58->dict != (Attribute *)0x0)) &&
           ((local_58->dict->id == TidyAttr_HREF && (BVar3 = hasValue(local_58), BVar3 != no)))) {
          _HasSkipOverLink = local_58->value;
          x = x + 1;
        }
      }
    }
  }
  BVar3 = Level2_Enabled(doc);
  if (BVar3 != no) {
    if (((x == 1) && (node->next != (Node *)0x0)) &&
       ((node->next->tag != (Dict *)0x0 && (node->next->tag->id == TidyTag_A)))) {
      for (local_58 = node->next->attributes; local_58 != (AttVal *)0x0; local_58 = local_58->next)
      {
        if ((((local_58 != (AttVal *)0x0) && (local_58->dict != (Attribute *)0x0)) &&
            (local_58->dict->id == TidyAttr_NAME)) &&
           ((BVar3 = hasValue(local_58), BVar3 != no &&
            (pcVar4 = strstr(_HasSkipOverLink,local_58->value), pcVar4 != (char *)0x0)))) {
          x = x + 1;
        }
      }
    }
    if (bVar2) {
      prvTidyReportAccessError(doc,node,0x2a8);
      BVar3 = Level3_Enabled(doc);
      if ((BVar3 != no) && ((int)x < 2)) {
        prvTidyReportAccessError(doc,node,0x30a);
      }
    }
  }
  return;
}

Assistant:

static void CheckASCII( TidyDocImpl* doc, Node* node )
{
    Node* temp1;
    Node* temp2;

    tmbstr skipOver = NULL;
    Bool IsAscii = no;
    int HasSkipOverLink = 0;
        
    uint i, x;
    int newLines = -1;
    tmbchar compareLetter;
    int matchingCount = 0;
    AttVal* av;
    
    if (Level1_Enabled( doc ) && node->content)
    {
        /* 
           Checks the text within the PRE and XMP tags to see if ascii 
           art is present 
        */
        for (i = node->content->start + 1; i < node->content->end; i++)
        {
            matchingCount = 0;

            /* Counts the number of lines of text */
            if (doc->lexer->lexbuf[i] == '\n')
            {
                newLines++;
            }
            
            compareLetter = doc->lexer->lexbuf[i];

            /* Counts consecutive character matches */
            for (x = i; x < i + 5; x++)
            {
                if (doc->lexer->lexbuf[x] == compareLetter)
                {
                    matchingCount++;
                }

                else
                {
                    break;
                }
            }

            /* Must have at least 5 consecutive character matches */
            if (matchingCount >= 5)
            {
                break;
            }
        }

        /* 
           Must have more than 6 lines of text OR 5 or more consecutive 
           letters that are the same for there to be ascii art 
        */
        if (newLines >= 6 || matchingCount >= 5)
        {
            IsAscii = yes;
        }

        /* Checks for skip over link if ASCII art is present */
        if (IsAscii == yes)
        {
            if (node->prev != NULL && node->prev->prev != NULL)
            {
                temp1 = node->prev->prev;

                /* Checks for 'HREF' attribute */
                for (av = temp1->attributes; av != NULL; av = av->next)
                {
                    if ( attrIsHREF(av) && hasValue(av) )
                    {
                        skipOver = av->value;
                        HasSkipOverLink++;
                    }
                }
            }
        }
    }

    if (Level2_Enabled( doc ))
    {
        /* 
           Checks for A element following PRE to ensure proper skipover link
           only if there is an A element preceding PRE.
        */
        if (HasSkipOverLink == 1)
        {
            if ( nodeIsA(node->next) )
            {
                temp2 = node->next;
                
                /* Checks for 'NAME' attribute */
                for (av = temp2->attributes; av != NULL; av = av->next)
                {
                    if ( attrIsNAME(av) && hasValue(av) )
                    {
                        /* 
                           Value within the 'HREF' attribute must be the same
                           as the value within the 'NAME' attribute for valid
                           skipover.
                        */
                        if ( strstr(skipOver, av->value) != NULL )
                        {
                            HasSkipOverLink++;
                        }
                    }
                }
            }
        }

        if (IsAscii == yes)
        {
            TY_(ReportAccessError)( doc, node, ASCII_REQUIRES_DESCRIPTION);
            if (Level3_Enabled( doc ) && (HasSkipOverLink < 2))
                TY_(ReportAccessError)( doc, node, SKIPOVER_ASCII_ART);
        }

    }
}